

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f2c_lite.c
# Opt level: O0

float z_abs(complex *z)

{
  float fVar1;
  complex *z_local;
  
  fVar1 = f__cabs(z->r,z->i);
  return fVar1;
}

Assistant:

float
z_abs(z)
complex *z;
#else
float f__cabs(float, float);
float
z_abs(complex * z)
#endif
{
    return (f__cabs(z->r, z->i));
}


#ifdef KR_headers
extern void sig_die();
VOID
z_div(c, a, b)
complex *a, *b, *c;
#else
extern void sig_die(char *, int);
void
z_div(complex * c, complex * a, complex * b)
#endif
{
    float ratio, den;
    float abr, abi;

    if ((abr = b->r) < 0.)
        abr = -abr;
    if ((abi = b->i) < 0.)
        abi = -abi;
    if (abr <= abi) {
        /*Let IEEE Infinties handle this ;( */
        /*if(abi == 0)
           sig_die("complex division by zero", 1); */
        ratio = b->r / b->i;
        den = b->i * (1 + ratio * ratio);
        c->r = (a->r * ratio + a->i) / den;
        c->i = (a->i * ratio - a->r) / den;
    }